

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spreadsketch.cpp
# Opt level: O0

int __thiscall DetectorSS::PointQuery(DetectorSS *this,uint32_t key)

{
  long in_RDI;
  uchar *unaff_retaddr;
  int in_stack_0000000c;
  DetectorSS *in_stack_00000010;
  uint bucket_1;
  int i_1;
  uint bucket;
  int i;
  int degree;
  int ret;
  uint32_t hashval [4];
  uint32_t hkey [3];
  int local_50;
  int local_4c;
  int local_3c;
  int local_34;
  int local_2c;
  undefined1 local_28 [28];
  undefined1 local_c [12];
  
  memset(local_28,0,0x10);
  MurmurHash3_x64_128(_bucket,i_1,bucket_1,in_stack_00000010);
  local_2c = 0;
  for (local_34 = 0; local_34 < *(int *)(in_RDI + 0x54); local_34 = local_34 + 1) {
    if (local_34 == 0) {
      local_2c = Estimate(in_stack_00000010,in_stack_0000000c,unaff_retaddr);
    }
    local_4c = Estimate(in_stack_00000010,in_stack_0000000c,unaff_retaddr);
    if (local_2c <= local_4c) {
      local_4c = local_2c;
    }
    local_2c = local_4c;
  }
  for (local_3c = 4; local_3c < *(int *)(in_RDI + 0x20); local_3c = local_3c + 1) {
    MurmurHash64A(local_c,*(int *)(in_RDI + 0x50) / 8,
                  *(uint64_t *)(*(long *)(in_RDI + 0x38) + (long)local_3c * 8));
    local_50 = Estimate(in_stack_00000010,in_stack_0000000c,unaff_retaddr);
    if (local_2c <= local_50) {
      local_50 = local_2c;
    }
    local_2c = local_50;
  }
  return local_2c;
}

Assistant:

int DetectorSS::PointQuery(uint32_t key) {
	uint32_t hkey[3] = { key, key, key };
	uint32_t hashval[4] = { 0 };
	MurmurHash3_x64_128((unsigned char*)hkey, 12, ss_.hash[0], (unsigned char*)hashval);
	int ret = 0;
	int degree = 0;
	for (int i = 0; i < ss_.tdepth; i++) {
		unsigned bucket = (uint32_t)hashval[i] * (unsigned long)ss_.width >> 32;
		if (i == 0) {
			ret = Estimate(bucket, ss_.counts[i]);
		}
		degree = Estimate(bucket, ss_.counts[i]);
		ret = ret > degree ? degree : ret;
	}
	for (int i = 4; i < ss_.depth; i++) {
		unsigned bucket = MurmurHash64A((unsigned char*)(&key), ss_.lgn / 8, ss_.hash[i]);
		bucket = (bucket * (unsigned long)ss_.width) >> 32;
		degree = Estimate(bucket, ss_.counts[i]);
		ret = ret > degree ? degree : ret;
	}
	return ret;
}